

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fission.cpp
# Opt level: O3

bool __thiscall spvtools::opt::LoopFissionImpl::CanPerformSplit(LoopFissionImpl *this)

{
  _Rb_tree_header *p_Var1;
  int64_t *piVar2;
  IRContext *context;
  ulong uVar3;
  pointer pDVar4;
  _Base_ptr p_Var5;
  bool bVar6;
  bool bVar7;
  LoopFissionImpl *pLVar8;
  Loop *pLVar9;
  mapped_type_conflict *pmVar10;
  set<spvtools::opt::Instruction_*,_std::less<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *__range2;
  map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
  *this_00;
  iterator __position;
  LoopFissionImpl *this_01;
  LoopFissionImpl *this_02;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  size_type __n;
  Instruction *store;
  Instruction *inst_1;
  DistanceVector vec;
  vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> loops;
  Instruction *inst;
  LoopDependenceAnalysis analysis;
  allocator_type local_1f9;
  Instruction *local_1f8;
  Instruction *local_1f0;
  Loop *local_1e8;
  DistanceVector local_1e0;
  _Base_ptr local_1c8;
  _Base_ptr p_Stack_1c0;
  _Base_ptr local_1b8;
  _Base_ptr local_1a8;
  _Base_ptr p_Stack_1a0;
  _Base_ptr local_198;
  vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> local_188;
  value_type local_168;
  LoopFissionImpl *local_140;
  LoopFissionImpl *local_138;
  vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_> local_130;
  LoopDependenceAnalysis local_118;
  
  if (this->load_used_in_condition_ != false) {
    return false;
  }
  local_188.
  super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8 = this->loop_;
  if (local_1e8 != (Loop *)0x0) {
    do {
      if (local_188.
          super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_188.
          super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<spvtools::opt::Loop_const*,std::allocator<spvtools::opt::Loop_const*>>::
        _M_realloc_insert<spvtools::opt::Loop_const*const&>
                  ((vector<spvtools::opt::Loop_const*,std::allocator<spvtools::opt::Loop_const*>> *)
                   &local_188,
                   (iterator)
                   local_188.
                   super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_1e8);
      }
      else {
        *local_188.
         super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = local_1e8;
        local_188.
        super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_188.
             super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      local_1e8 = local_1e8->parent_;
    } while (local_1e8 != (Loop *)0x0);
  }
  context = this->context_;
  std::vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>::vector
            (&local_130,&local_188);
  local_118.context_ = context;
  std::vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>::vector
            (&local_118.loops_,&local_130);
  ScalarEvolutionAnalysis::ScalarEvolutionAnalysis(&local_118.scalar_evolution_,context);
  local_118.constraints_.
  super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_118.constraints_;
  local_118.debug_stream_ = (ostream *)0x0;
  local_118.constraints_.
  super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this_02 = (LoopFissionImpl *)
            local_130.
            super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_118.constraints_.
  super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_118.constraints_.
       super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  if ((LoopFissionImpl *)
      local_130.
      super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (LoopFissionImpl *)0x0) {
    operator_delete(local_130.
                    super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_130.
                          super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.
                          super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    this_02 = (LoopFissionImpl *)
              local_130.
              super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  local_1a8 = (_Base_ptr)0x0;
  p_Stack_1a0 = (_Base_ptr)0x0;
  local_198 = (_Base_ptr)0x0;
  local_1b8 = (_Base_ptr)0x0;
  local_1c8 = (_Base_ptr)0x0;
  p_Stack_1c0 = (_Base_ptr)0x0;
  pLVar8 = (LoopFissionImpl *)
           (this->cloned_loop_instructions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->cloned_loop_instructions_)._M_t._M_impl.super__Rb_tree_header;
  if (pLVar8 != (LoopFissionImpl *)p_Var1) {
    this_01 = this_02;
    do {
      this_02 = pLVar8;
      local_168._0_8_ =
           (this_02->cloned_loop_instructions_)._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_right;
      if (((Instruction *)local_168._0_8_)->opcode_ == OpLoad) {
        __position._M_current = (Instruction **)p_Stack_1c0;
        pLVar8 = (LoopFissionImpl *)&local_1c8;
        if (p_Stack_1c0 == local_1b8) {
LAB_002447d4:
          std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>::
          _M_realloc_insert<spvtools::opt::Instruction*const&>
                    ((vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>
                      *)pLVar8,__position,(Instruction **)&local_168);
          this_01 = pLVar8;
        }
        else {
          *(undefined8 *)p_Stack_1c0 = local_168._0_8_;
          p_Stack_1c0 = (_Base_ptr)&p_Stack_1c0->_M_parent;
        }
      }
      else if (((Instruction *)local_168._0_8_)->opcode_ == OpStore) {
        __position._M_current = (Instruction **)p_Stack_1a0;
        pLVar8 = (LoopFissionImpl *)&local_1a8;
        if (p_Stack_1a0 == local_198) goto LAB_002447d4;
        *(undefined8 *)p_Stack_1a0 = local_168._0_8_;
        p_Stack_1a0 = (_Base_ptr)&p_Stack_1a0->_M_parent;
      }
      bVar6 = MovableInstruction(this_01,(Instruction *)local_168._0_8_);
      if (!bVar6) goto LAB_00244aa5;
      pLVar8 = (LoopFissionImpl *)std::_Rb_tree_increment((_Rb_tree_node_base *)this_02);
      this_01 = this_02;
    } while (pLVar8 != (LoopFissionImpl *)p_Var1);
  }
  pLVar9 = this->loop_;
  __n = 0;
  do {
    pLVar9 = pLVar9->parent_;
    __n = __n + 1;
  } while (pLVar9 != (Loop *)0x0);
  pLVar8 = (LoopFissionImpl *)
           (this->original_loop_instructions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_140 = (LoopFissionImpl *)
              &(this->original_loop_instructions_)._M_t._M_impl.super__Rb_tree_header;
  bVar6 = true;
  if (pLVar8 != local_140) {
    this_00 = &this->instruction_order_;
    do {
      local_1f0 = (Instruction *)
                  (pLVar8->cloned_loop_instructions_)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_right;
      local_138 = pLVar8;
      bVar6 = MovableInstruction(this_02,local_1f0);
      p_Var5 = p_Stack_1a0;
      p_Var11 = p_Stack_1c0;
      if (!bVar6) goto LAB_00244aa5;
      p_Var12 = local_1c8;
      if (local_1f0->opcode_ == OpStore) {
        for (; p_Var12 != p_Var11; p_Var12 = (_Base_ptr)&p_Var12->_M_parent) {
          local_1f8 = *(Instruction **)p_Var12;
          local_168._0_8_ = (Instruction *)0x700000000;
          local_168.distance = 0;
          local_168.peel_first = false;
          local_168.peel_last = false;
          local_168.point_x = 0;
          local_168.point_y = 0;
          std::vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>::
          vector(&local_1e0.entries,__n,&local_168,&local_1f9);
          pmVar10 = std::
                    map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                    ::operator[](this_00,&local_1f8);
          uVar3 = *pmVar10;
          pmVar10 = std::
                    map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                    ::operator[](this_00,&local_1f0);
          if (*pmVar10 < uVar3) {
            bVar6 = false;
          }
          else {
            bVar7 = LoopDependenceAnalysis::GetDependence(&local_118,local_1f0,local_1f8,&local_1e0)
            ;
            bVar6 = true;
            pDVar4 = local_1e0.entries.
                     super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (!bVar7) {
              do {
                if (pDVar4 == local_1e0.entries.
                              super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish) break;
                bVar6 = -1 < pDVar4->distance;
                pDVar4 = pDVar4 + 1;
              } while (bVar6);
            }
          }
          if (local_1e0.entries.
              super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1e0.entries.
                            super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_1e0.entries.
                                  super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1e0.entries.
                                  super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (!bVar6) goto LAB_00244aa5;
        }
      }
      else {
        p_Var11 = local_1a8;
        if (local_1f0->opcode_ == OpLoad) {
          for (; p_Var11 != p_Var5; p_Var11 = (_Base_ptr)&p_Var11->_M_parent) {
            local_1f8 = *(Instruction **)p_Var11;
            local_168._0_8_ = (Instruction *)0x700000000;
            local_168.distance = 0;
            local_168.peel_first = false;
            local_168.peel_last = false;
            local_168.point_x = 0;
            local_168.point_y = 0;
            std::vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
            ::vector(&local_1e0.entries,__n,&local_168,&local_1f9);
            pmVar10 = std::
                      map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                      ::operator[](this_00,&local_1f8);
            uVar3 = *pmVar10;
            pmVar10 = std::
                      map<spvtools::opt::Instruction_*,_unsigned_long,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_unsigned_long>_>_>
                      ::operator[](this_00,&local_1f0);
            if (*pmVar10 < uVar3) {
              bVar6 = false;
            }
            else {
              bVar7 = LoopDependenceAnalysis::GetDependence
                                (&local_118,local_1f8,local_1f0,&local_1e0);
              bVar6 = true;
              pDVar4 = local_1e0.entries.
                       super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (!bVar7) {
                do {
                  if (pDVar4 == local_1e0.entries.
                                super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish) break;
                  piVar2 = &pDVar4->distance;
                  bVar6 = *piVar2 < 1;
                  pDVar4 = pDVar4 + 1;
                } while (*piVar2 < 1);
              }
            }
            if (local_1e0.entries.
                super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1e0.entries.
                              super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_1e0.entries.
                                    super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1e0.entries.
                                    super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (!bVar6) goto LAB_00244aa5;
          }
        }
      }
      this_02 = local_138;
      pLVar8 = (LoopFissionImpl *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_138);
    } while (pLVar8 != local_140);
    bVar6 = true;
  }
LAB_00244aa7:
  if (local_1c8 != (_Base_ptr)0x0) {
    operator_delete(local_1c8,(long)local_1b8 - (long)local_1c8);
  }
  if (local_1a8 != (_Base_ptr)0x0) {
    operator_delete(local_1a8,(long)local_198 - (long)local_1a8);
  }
  std::__cxx11::
  _List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
  ::_M_clear(&local_118.constraints_.
              super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
            );
  std::
  _Rb_tree<const_spvtools::opt::Loop_*,_std::pair<const_spvtools::opt::Loop_*const,_const_spvtools::opt::Loop_*>,_std::_Select1st<std::pair<const_spvtools::opt::Loop_*const,_const_spvtools::opt::Loop_*>_>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_spvtools::opt::Loop_*const,_const_spvtools::opt::Loop_*>_>_>
  ::_M_erase(&local_118.scalar_evolution_.pretend_equal_._M_t,
             (_Link_type)
             local_118.scalar_evolution_.pretend_equal_._M_t._M_impl.super__Rb_tree_header._M_header
             ._M_parent);
  std::
  _Hashtable<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>,_std::allocator<std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>_>,_std::__detail::_Identity,_spvtools::opt::ScalarEvolutionAnalysis::NodePointersEquality,_spvtools::opt::SENodeHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_118.scalar_evolution_.node_cache_._M_h);
  std::
  _Rb_tree<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>,_std::_Select1st<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
  ::_M_erase(&local_118.scalar_evolution_.recurrent_node_map_._M_t,
             (_Link_type)
             local_118.scalar_evolution_.recurrent_node_map_._M_t._M_impl.super__Rb_tree_header.
             _M_header._M_parent);
  if (local_118.loops_.
      super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.loops_.
                    super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.loops_.
                          super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.loops_.
                          super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Base_ptr)
      local_188.
      super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
    operator_delete(local_188.
                    super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_188.
                          super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.
                          super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar6;
LAB_00244aa5:
  bVar6 = false;
  goto LAB_00244aa7;
}

Assistant:

bool LoopFissionImpl::CanPerformSplit() {
  // Return false if any of the condition instructions in the loop depend on a
  // load.
  if (load_used_in_condition_) {
    return false;
  }

  // Build a list of all parent loops of this loop. Loop dependence analysis
  // needs this structure.
  std::vector<const Loop*> loops;
  Loop* parent_loop = loop_;
  while (parent_loop) {
    loops.push_back(parent_loop);
    parent_loop = parent_loop->GetParent();
  }

  LoopDependenceAnalysis analysis{context_, loops};

  // A list of all the stores in the cloned loop.
  std::vector<Instruction*> set_one_stores{};

  // A list of all the loads in the cloned loop.
  std::vector<Instruction*> set_one_loads{};

  // Populate the above lists.
  for (Instruction* inst : cloned_loop_instructions_) {
    if (inst->opcode() == spv::Op::OpStore) {
      set_one_stores.push_back(inst);
    } else if (inst->opcode() == spv::Op::OpLoad) {
      set_one_loads.push_back(inst);
    }

    // If we find any instruction which we can't move (such as a barrier),
    // return false.
    if (!MovableInstruction(*inst)) return false;
  }

  // We need to calculate the depth of the loop to create the loop dependency
  // distance vectors.
  const size_t loop_depth = loop_->GetDepth();

  // Check the dependencies between loads in the cloned loop and stores in the
  // original and vice versa.
  for (Instruction* inst : original_loop_instructions_) {
    // If we find any instruction which we can't move (such as a barrier),
    // return false.
    if (!MovableInstruction(*inst)) return false;

    // Look at the dependency between the loads in the original and stores in
    // the cloned loops.
    if (inst->opcode() == spv::Op::OpLoad) {
      for (Instruction* store : set_one_stores) {
        DistanceVector vec{loop_depth};

        // If the store actually should appear after the load, return false.
        // This means the store has been placed in the wrong grouping.
        if (instruction_order_[store] > instruction_order_[inst]) {
          return false;
        }
        // If not independent check the distance vector.
        if (!analysis.GetDependence(store, inst, &vec)) {
          for (DistanceEntry& entry : vec.GetEntries()) {
            // A distance greater than zero means that the store in the cloned
            // loop has a dependency on the load in the original loop.
            if (entry.distance > 0) return false;
          }
        }
      }
    } else if (inst->opcode() == spv::Op::OpStore) {
      for (Instruction* load : set_one_loads) {
        DistanceVector vec{loop_depth};

        // If the load actually should appear after the store, return false.
        if (instruction_order_[load] > instruction_order_[inst]) {
          return false;
        }

        // If not independent check the distance vector.
        if (!analysis.GetDependence(inst, load, &vec)) {
          for (DistanceEntry& entry : vec.GetEntries()) {
            // A distance less than zero means the load in the cloned loop is
            // dependent on the store instruction in the original loop.
            if (entry.distance < 0) return false;
          }
        }
      }
    }
  }
  return true;
}